

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O3

int google::posix_strerror_r(int err,char *buf,size_t len)

{
  int iVar1;
  int *piVar2;
  char *__src;
  
  if (buf == (char *)0x0 || len == 0) {
    piVar2 = __errno_location();
    *piVar2 = 0x16;
  }
  else {
    *buf = '\0';
    piVar2 = __errno_location();
    iVar1 = *piVar2;
    *piVar2 = 0;
    __src = strerror_r(err,buf,len);
    if (*piVar2 == 0) {
      *piVar2 = iVar1;
      buf[len - 1] = '\0';
      if (__src == buf || __src == (char *)0x0) {
        return 0;
      }
      *buf = '\0';
      strncat(buf,__src,len - 1);
      return 0;
    }
    *buf = '\0';
  }
  return -1;
}

Assistant:

GLOG_NO_EXPORT
int posix_strerror_r(int err, char* buf, size_t len) {
  // Sanity check input parameters
  if (buf == nullptr || len <= 0) {
    errno = EINVAL;
    return -1;
  }

  // Reset buf and errno, and try calling whatever version of strerror_r()
  // is implemented by glibc
  buf[0] = '\000';
  int old_errno = errno;
  errno = 0;
  char* rc = reinterpret_cast<char*>(strerror_r(err, buf, len));

  // Both versions set errno on failure
  if (errno) {
    // Should already be there, but better safe than sorry
    buf[0] = '\000';
    return -1;
  }
  errno = old_errno;

  // POSIX is vague about whether the string will be terminated, although
  // is indirectly implies that typically ERANGE will be returned, instead
  // of truncating the string. This is different from the GNU implementation.
  // We play it safe by always terminating the string explicitly.
  buf[len - 1] = '\000';

  // If the function succeeded, we can use its exit code to determine the
  // semantics implemented by glibc
  if (!rc) {
    return 0;
  } else {
    // GNU semantics detected
    if (rc == buf) {
      return 0;
    } else {
      buf[0] = '\000';
#if defined(GLOG_OS_MACOSX) || defined(GLOG_OS_FREEBSD) || \
    defined(GLOG_OS_OPENBSD)
      if (reinterpret_cast<intptr_t>(rc) < sys_nerr) {
        // This means an error on MacOSX or FreeBSD.
        return -1;
      }
#endif
      strncat(buf, rc, len - 1);
      return 0;
    }
  }
}